

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_insert_delete_gives_null(CuTest *tc)

{
  selist *tc_00;
  int iVar1;
  selist *local_18;
  selist *ql;
  CuTest *tc_local;
  
  local_18 = (selist *)0x0;
  ql = (selist *)tc;
  iVar1 = selist_empty((selist *)0x0);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x85,(char *)0x0,1,iVar1);
  selist_push(&local_18,lipsum);
  tc_00 = ql;
  iVar1 = selist_empty(local_18);
  CuAssertIntEquals_LineMsg
            ((CuTest *)tc_00,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x87,(char *)0x0,0,iVar1);
  selist_delete(&local_18,0);
  CuAssertPtrEquals_LineMsg
            ((CuTest *)ql,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x89,(char *)0x0,(void *)0x0,local_18);
  selist_free(local_18);
  return;
}

Assistant:

static void test_insert_delete_gives_null(CuTest * tc)
{
    struct selist *ql = NULL;
    CuAssertIntEquals(tc, 1, selist_empty(ql));
    selist_push(&ql, (void *)lipsum);
    CuAssertIntEquals(tc, 0, selist_empty(ql));
    selist_delete(&ql, 0);
    CuAssertPtrEquals(tc, NULL, ql);
    selist_free(ql);
}